

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O1

int __thiscall
H264StreamReader::writeSEIMessage
          (H264StreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,SEIUnit *sei,
          uint8_t payloadType)

{
  byte *pbVar1;
  SPSUnit *sps;
  _Base_ptr p_Var2;
  undefined4 *puVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  const_iterator __begin3;
  byte *pbVar7;
  uint8_t *puVar8;
  int iVar9;
  bool bVar10;
  BitStreamWriter writer;
  ostringstream ss;
  uint8_t tmpBuffer [256];
  BitStreamWriter local_330;
  SEIUnit *local_310;
  uint8_t *local_308;
  char *local_300;
  uint *local_2f8;
  undefined8 local_2f0;
  uint local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  uint *local_2d8;
  undefined8 local_2d0;
  uint local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  uint8_t *local_2b8;
  ostringstream local_2b0 [376];
  uint local_138 [66];
  
  if ((long)dstEnd - (long)dstBuffer < 4) {
    std::__cxx11::ostringstream::ostringstream(local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"H264 stream error: Not enough buffer for write headers",0x36);
    puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar3 = 3;
    *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
    if (local_2d8 == &local_2c8) {
      puVar3[6] = local_2c8;
      puVar3[7] = uStack_2c4;
      puVar3[8] = uStack_2c0;
      puVar3[9] = uStack_2bc;
    }
    else {
      *(uint **)(puVar3 + 2) = local_2d8;
      *(ulong *)(puVar3 + 6) = CONCAT44(uStack_2c4,local_2c8);
    }
    *(undefined8 *)(puVar3 + 4) = local_2d0;
    local_2d0 = 0;
    local_2c8 = local_2c8 & 0xffffff00;
    local_2d8 = &local_2c8;
    __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  puVar8 = dstBuffer;
  if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
    puVar8 = dstBuffer + 1;
    *dstBuffer = '\0';
  }
  puVar8[0] = '\0';
  puVar8[1] = '\0';
  puVar8[2] = '\x01';
  local_330.super_BitStream.m_totalBits = 0x800;
  local_330.super_BitStream.m_buffer = local_138;
  local_330.m_curVal = 0;
  local_330.m_bitWrited = 0;
  bVar10 = this->m_mvcSubStream;
  local_330.super_BitStream.m_initBuffer = local_330.super_BitStream.m_buffer;
  local_2b8 = dstEnd;
  BitStreamWriter::putBits(&local_330,8,6);
  if (bVar10 == true) {
    local_310 = sei;
    local_308 = dstBuffer;
    BitStreamWriter::putBits(&local_330,8,0x25);
    iVar4 = (int)local_330.super_BitStream.m_buffer - (int)local_330.super_BitStream.m_initBuffer;
    iVar9 = local_330.m_bitWrited + iVar4 * 8;
    iVar4 = local_330.m_bitWrited + iVar4 * 8 + 7;
    if (-1 < iVar9) {
      iVar4 = iVar9;
    }
    local_300 = (char *)((long)(iVar4 >> 3) + (long)local_330.super_BitStream.m_initBuffer);
    BitStreamWriter::putBits(&local_330,8,0);
    iVar9 = ((int)local_330.super_BitStream.m_initBuffer - (int)local_330.super_BitStream.m_buffer)
            * 8 - local_330.m_bitWrited;
    pbVar7 = (this->m_lastSeiMvcHeader).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar1 = (this->m_lastSeiMvcHeader).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar7 == pbVar1) {
      BitStreamWriter::putBits(&local_330,8,0xc0);
      BitStreamWriter::putBits(&local_330,8,0x10);
      dstBuffer = local_308;
      sei = local_310;
    }
    else {
      do {
        BitStreamWriter::putBits(&local_330,8,(uint)*pbVar7);
        pbVar7 = pbVar7 + 1;
        dstBuffer = local_308;
        sei = local_310;
      } while (pbVar7 != pbVar1);
    }
  }
  else {
    iVar9 = 0;
    local_300 = (char *)0x0;
  }
  BitStreamWriter::putBits(&local_330,8,(uint)payloadType);
  p_Var6 = (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = p_Var2;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      bVar10 = p_Var6[1]._M_color < this->m_lastSliceSPS;
      if (!bVar10) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar10];
    } while (p_Var6 != (_Base_ptr)0x0);
  }
  if ((p_Var5 != p_Var2) && (p_Var5[1]._M_color <= this->m_lastSliceSPS)) {
    p_Var2 = p_Var5;
  }
  puVar8 = puVar8 + 3;
  sps = (SPSUnit *)p_Var2[1]._M_parent;
  if (sps != (SPSUnit *)0x0) {
    if (payloadType == '\0') {
      SEIUnit::serialize_buffering_period_message(sei,sps,&local_330,false);
    }
    else {
      SEIUnit::serialize_pic_timing_message(sei,sps,&local_330,false);
    }
    if (local_300 != (char *)0x0) {
      *local_300 = (char)(iVar9 + local_330.m_bitWrited >> 3) +
                   ((char)local_330.super_BitStream.m_buffer -
                   (char)local_330.super_BitStream.m_initBuffer);
    }
    NALUnit::write_rbsp_trailing_bits(&local_330);
    BitStreamWriter::flushBits(&local_330);
    iVar9 = local_330.m_bitWrited +
            ((int)local_330.super_BitStream.m_buffer - (int)local_330.super_BitStream.m_initBuffer)
            * 8;
    iVar4 = local_330.m_bitWrited +
            ((int)local_330.super_BitStream.m_buffer - (int)local_330.super_BitStream.m_initBuffer)
            * 8 + 7;
    if (-1 < iVar9) {
      iVar4 = iVar9;
    }
    iVar9 = NALUnit::encodeNAL((uint8_t *)local_138,
                               (uint8_t *)((long)local_138 + (long)(iVar4 >> 3)),puVar8,
                               (long)local_2b8 - (long)puVar8);
    if (iVar9 == -1) {
      std::__cxx11::ostringstream::ostringstream(local_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2b0,"H264 stream error: Not enough buffer for write headers",0x36)
      ;
      puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar3 = 3;
      *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
      if (local_2f8 == &local_2e8) {
        puVar3[6] = local_2e8;
        puVar3[7] = uStack_2e4;
        puVar3[8] = uStack_2e0;
        puVar3[9] = uStack_2dc;
      }
      else {
        *(uint **)(puVar3 + 2) = local_2f8;
        *(ulong *)(puVar3 + 6) = CONCAT44(uStack_2e4,local_2e8);
      }
      *(undefined8 *)(puVar3 + 4) = local_2f0;
      local_2f0 = 0;
      local_2e8 = local_2e8 & 0xffffff00;
      local_2f8 = &local_2e8;
      __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    puVar8 = puVar8 + iVar9;
  }
  return (int)puVar8 - (int)dstBuffer;
}

Assistant:

int H264StreamReader::writeSEIMessage(uint8_t *dstBuffer, const uint8_t *dstEnd, const SEIUnit &sei,
                                      const uint8_t payloadType) const
{
    uint8_t *curPos = dstBuffer;

    if (dstEnd - curPos < 4)
        THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")

    uint8_t tmpBuffer[256];
    BitStreamWriter writer{};
    curPos = writeNalPrefix(curPos);
    writer.setBuffer(tmpBuffer, tmpBuffer + sizeof(tmpBuffer));

    uint8_t *sizeField = nullptr;
    unsigned beforeMessageLen = 0;
    if (m_mvcSubStream)
    {
        writer.putBits(8, static_cast<int>(NALUnit::NALType::nuSEI));
        writer.putBits(8, SEI_MSG_MVC_SCALABLE_NESTING);

        sizeField = writer.getBuffer() + writer.getBitsCount() / 8;
        writer.putBits(8, 0);  // skip size field
        beforeMessageLen = writer.getBitsCount();

        static constexpr uint8_t DEFAULT_MVC_SEI_HEADER[] = {192, 16};
        if (!m_lastSeiMvcHeader.empty())
        {
            for (const auto &i : m_lastSeiMvcHeader) writer.putBits(8, i);
        }
        else
        {
            writer.putBits(8, DEFAULT_MVC_SEI_HEADER[0]);
            writer.putBits(8, DEFAULT_MVC_SEI_HEADER[1]);
        }

        writer.putBits(8, payloadType);
    }
    else
    {
        writer.putBits(8, static_cast<int>(NALUnit::NALType::nuSEI));
        writer.putBits(8, payloadType);
    }

    const SPSUnit *sps = m_spsMap.find(m_lastSliceSPS)->second;
    if (sps)
    {
        if (payloadType == 0)
            sei.serialize_buffering_period_message(*sps, writer, false);

        else
            sei.serialize_pic_timing_message(*sps, writer, false);

        if (sizeField)
        {
            const unsigned msgLen = writer.getBitsCount() - beforeMessageLen;
            *sizeField = static_cast<uint8_t>(msgLen / 8);
        }
        SEIUnit::write_rbsp_trailing_bits(writer);
        writer.flushBits();

        const int sRez = SEIUnit::encodeNAL(tmpBuffer, tmpBuffer + writer.getBitsCount() / 8, curPos, dstEnd - curPos);
        if (sRez == -1)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos += sRez;
    }

    return static_cast<int>(curPos - dstBuffer);
}